

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-sve.c
# Opt level: O3

_Bool do_perm_pred2(DisasContext_conflict1 *s,arg_rr_esz *a,_Bool high_odd,
                   gen_helper_gvec_2_conflict1 *fn)

{
  int iVar1;
  TCGContext_conflict1 *s_00;
  _Bool _Var2;
  undefined1 extraout_AL;
  TCGTemp *ts;
  TCGTemp *ts_00;
  TCGv_i32 pTVar3;
  uintptr_t o;
  
  s_00 = s->uc->tcg_ctx;
  _Var2 = sve_access_check_aarch64(s);
  if (_Var2) {
    iVar1 = s->sve_len;
    ts = tcg_temp_new_internal_aarch64(s_00,TCG_TYPE_I64,false);
    ts_00 = tcg_temp_new_internal_aarch64(s_00,TCG_TYPE_I64,false);
    tcg_gen_addi_i64_aarch64
              (s_00,(TCGv_i64)((long)ts - (long)s_00),(TCGv_i64)s_00->cpu_env,
               (long)(a->rd * 0x20 + 0x2c10));
    tcg_gen_addi_i64_aarch64
              (s_00,(TCGv_i64)((long)ts_00 - (long)s_00),(TCGv_i64)s_00->cpu_env,
               (long)(a->rn * 0x20 + 0x2c10));
    pTVar3 = tcg_const_i32_aarch64
                       (s_00,(uint)high_odd << 0xc | (iVar1 >> 3) - 2U & 0xffffc3ff |
                             (a->esz & 3U) << 10);
    (*fn)(s_00,(TCGv_ptr)((long)ts - (long)s_00),(TCGv_ptr)((long)ts_00 - (long)s_00),pTVar3);
    tcg_temp_free_internal_aarch64(s_00,(TCGTemp *)(pTVar3 + (long)s_00));
    tcg_temp_free_internal_aarch64(s_00,ts);
    tcg_temp_free_internal_aarch64(s_00,ts_00);
    return (_Bool)extraout_AL;
  }
  return _Var2;
}

Assistant:

static bool do_perm_pred2(DisasContext *s, arg_rr_esz *a, bool high_odd,
                          gen_helper_gvec_2 *fn)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    if (!sve_access_check(s)) {
        return true;
    }

    unsigned vsz = pred_full_reg_size(s);
    TCGv_ptr t_d = tcg_temp_new_ptr(tcg_ctx);
    TCGv_ptr t_n = tcg_temp_new_ptr(tcg_ctx);
    TCGv_i32 t_desc;
    int desc;

    tcg_gen_addi_ptr(tcg_ctx, t_d, tcg_ctx->cpu_env, pred_full_reg_offset(s, a->rd));
    tcg_gen_addi_ptr(tcg_ctx, t_n, tcg_ctx->cpu_env, pred_full_reg_offset(s, a->rn));

    /* Predicate sizes may be smaller and cannot use simd_desc.
       We cannot round up, as we do elsewhere, because we need
       the exact size for ZIP2 and REV.  We retain the style for
       the other helpers for consistency.  */

    desc = vsz - 2;
    desc = deposit32(desc, SIMD_DATA_SHIFT, 2, a->esz);
    desc = deposit32(desc, SIMD_DATA_SHIFT + 2, 2, high_odd);
    t_desc = tcg_const_i32(tcg_ctx, desc);

    fn(tcg_ctx, t_d, t_n, t_desc);

    tcg_temp_free_i32(tcg_ctx, t_desc);
    tcg_temp_free_ptr(tcg_ctx, t_d);
    tcg_temp_free_ptr(tcg_ctx, t_n);
    return true;
}